

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlaneMap.h
# Opt level: O0

void __thiscall PlaneMap::PlaneMap(PlaneMap *this,Vector *n,Vector *e1)

{
  Vector *u;
  Vector *u_00;
  double dVar1;
  Vector local_50;
  Vector local_38;
  Vector *local_20;
  Vector *e1_local;
  Vector *n_local;
  PlaneMap *this_local;
  
  local_20 = e1;
  e1_local = n;
  n_local = (Vector *)this;
  Map::Map(&this->super_Map);
  u_00 = e1_local;
  u = local_20;
  (this->super_Map)._vptr_Map = (_func_int **)&PTR__PlaneMap_001127c8;
  dVar1 = operator&(e1_local,local_20);
  operator*(&local_50,u_00,dVar1);
  dVar1 = operator&(e1_local,e1_local);
  operator/(&local_38,&local_50,dVar1);
  operator-(&this->eu,u,&local_38);
  operator^(&this->ev,e1_local,local_20);
  return;
}

Assistant:

PlaneMap(Vector const& n, Vector const& e1)
        : eu( e1 - n * (n & e1) / (n & n) )
        , ev( n ^ e1 )
    {}